

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O2

bool __thiscall tinyusdz::StreamReader::read_double(StreamReader *this,double *ret)

{
  bool bVar1;
  double value;
  double local_10;
  
  if (ret != (double *)0x0) {
    local_10 = 0.0;
    bVar1 = read8(this,(uint64_t *)&local_10);
    if (bVar1) {
      *ret = local_10;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool read_double(double *ret) const {
    if (!ret) {
      return false;
    }

    double value{};
    if (!read8(reinterpret_cast<uint64_t *>(&value))) {
      return false;
    }

    (*ret) = value;

    return true;
  }